

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O3

void Cec3_CollectSuper(Gia_Obj_t *pObj,int fUseMuxes,Vec_Ptr_t *vSuper)

{
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                  ,300,"void Cec3_CollectSuper(Gia_Obj_t *, int, Vec_Ptr_t *)");
  }
  if ((~*(uint *)pObj & 0x9fffffff) != 0) {
    vSuper->nSize = 0;
    Cec3_CollectSuper_rec(pObj,vSuper,1,fUseMuxes);
    return;
  }
  __assert_fail("!Gia_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                ,0x12d,"void Cec3_CollectSuper(Gia_Obj_t *, int, Vec_Ptr_t *)");
}

Assistant:

void Cec3_CollectSuper( Gia_Obj_t * pObj, int fUseMuxes, Vec_Ptr_t * vSuper )
{
    assert( !Gia_IsComplement(pObj) );
    assert( !Gia_ObjIsCi(pObj) );
    Vec_PtrClear( vSuper );
    Cec3_CollectSuper_rec( pObj, vSuper, 1, fUseMuxes );
}